

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O2

int jpc_dec_process_qcc(jpc_dec_t *dec,jpc_ms_t *ms)

{
  jpc_dec_tile_t *pjVar1;
  int iVar2;
  jpc_dec_cp_t *cp;
  
  if ((ms->parms).soc < dec->numcomps) {
    if (dec->state == 0x10) {
      pjVar1 = dec->curtile;
      if (pjVar1 == (jpc_dec_tile_t *)0x0) {
        return -1;
      }
      if (0 < pjVar1->partno) {
        return -1;
      }
      cp = pjVar1->cp;
    }
    else {
      if (dec->state != 4) {
        return 0;
      }
      cp = dec->cp;
    }
    jpc_dec_cp_setfromqcc(cp,&(ms->parms).qcc);
    iVar2 = 0;
  }
  else {
    jas_eprintf("invalid component number in QCC marker segment\n");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int jpc_dec_process_qcc(jpc_dec_t *dec, jpc_ms_t *ms)
{
	jpc_qcc_t *qcc = &ms->parms.qcc;
	jpc_dec_tile_t *tile;

	if (JAS_CAST(int, qcc->compno) >= dec->numcomps) {
		jas_eprintf("invalid component number in QCC marker segment\n");
		return -1;
	}
	switch (dec->state) {
	case JPC_MH:
		jpc_dec_cp_setfromqcc(dec->cp, qcc);
		break;
	case JPC_TPH:
		if (!(tile = dec->curtile)) {
			return -1;
		}
		if (tile->partno > 0) {
			return -1;
		}
		jpc_dec_cp_setfromqcc(tile->cp, qcc);
		break;
	}
	return 0;
}